

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O0

void Eigen::internal::LU_kernel_bmod<1>::
     run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int param_1,VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *param_3,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  ScalarWithConstIfNotLvalue *pSVar13;
  int *piVar14;
  double *pdVar15;
  Scalar d1;
  Scalar d0;
  Scalar a1;
  Scalar a0;
  int i1;
  int i0;
  int i;
  int *irow;
  Scalar *a;
  Scalar f;
  int lda_local;
  int *luptr_local;
  Matrix<double,__1,_1,_0,__1,_1> *lusup_local;
  Matrix<double,__1,_1,_0,__1,_1> *param_2_local;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *dense_local;
  int param_0_local;
  
  pSVar8 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,
                      (long)(lptr + no_zeros));
  pSVar9 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
           operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                       *)dense,(long)*pSVar8);
  dVar1 = *pSVar9;
  *luptr = lda * no_zeros + no_zeros + 1 + *luptr;
  pSVar10 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                      (&lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  irow = (int *)(pSVar10 + *luptr);
  pSVar11 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::data
                      (&lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>);
  _i0 = pSVar11 + (long)lptr + (long)no_zeros + 1;
  for (i1 = 0; i1 + 1 < nrow; i1 = i1 + 2) {
    piVar14 = _i0 + 1;
    iVar6 = *_i0;
    _i0 = _i0 + 2;
    iVar7 = *piVar14;
    pdVar15 = (double *)(irow + 2);
    dVar2 = *(double *)irow;
    irow = irow + 4;
    dVar3 = *pdVar15;
    pSVar12 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::coeff
                        ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                          *)dense,(long)iVar6);
    dVar4 = *pSVar12;
    pSVar12 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::coeff
                        ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                          *)dense,(long)iVar7);
    dVar5 = *pSVar12;
    pSVar13 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
              coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                        *)dense,(long)iVar6);
    *pSVar13 = -dVar1 * dVar2 + dVar4;
    pSVar13 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
              coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                        *)dense,(long)iVar7);
    *pSVar13 = -dVar1 * dVar3 + dVar5;
  }
  if (i1 < nrow) {
    dVar2 = *(double *)irow;
    pSVar13 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
              coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                        *)dense,(long)*_i0);
    *pSVar13 = -dVar1 * dVar2 + *pSVar13;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<1>::run(const int /*segsize*/, BlockScalarVector& dense, ScalarVector& /*tempv*/, ScalarVector& lusup, Index& luptr,
                                              const Index lda, const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  Scalar f = dense(lsub(lptr + no_zeros));
  luptr += lda * no_zeros + no_zeros + 1;
  const Scalar* a(lusup.data() + luptr);
  const /*typename IndexVector::Scalar*/Index*  irow(lsub.data()+lptr + no_zeros + 1);
  Index i = 0;
  for (; i+1 < nrow; i+=2)
  {
    Index i0 = *(irow++);
    Index i1 = *(irow++);
    Scalar a0 = *(a++);
    Scalar a1 = *(a++);
    Scalar d0 = dense.coeff(i0);
    Scalar d1 = dense.coeff(i1);
    d0 -= f*a0;
    d1 -= f*a1;
    dense.coeffRef(i0) = d0;
    dense.coeffRef(i1) = d1;
  }
  if(i<nrow)
    dense.coeffRef(*(irow++)) -= f * *(a++);
}